

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.h
# Opt level: O0

void __thiscall cfd::core::AbstractTxOut::AbstractTxOut(AbstractTxOut *this,AbstractTxOut *param_2)

{
  long in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = cfd::core::Transaction::GetWeight;
  in_RDI[1] = *(undefined8 *)(in_RSI + 8);
  in_RDI[2] = *(undefined8 *)(in_RSI + 0x10);
  cfd::core::Script::Script((Script *)(in_RDI + 3),(Script *)(in_RSI + 0x18));
  return;
}

Assistant:

class CFD_CORE_EXPORT AbstractTxOut {
 public:
  /**
   * @brief constructor
   */
  AbstractTxOut();
  /**
   * @brief constructor
   * @param[in] value             amount value.
   * @param[in] locking_script    locking script.
   */
  AbstractTxOut(const Amount& value, const Script& locking_script);
  /**
   * @brief constructor
   * @param[in] locking_script    locking script.
   */
  explicit AbstractTxOut(const Script& locking_script);
  /**
   * @brief destructor
   */
  virtual ~AbstractTxOut() {
    // do nothing
  }
  /**
   * @brief Get the amount.
   * @return amount
   */
  const Amount GetValue() const;
  /**
   * @brief Get the locking script.
   * @return locking script
   */
  const Script GetLockingScript() const;
  /**
   * @brief get value amount.
   * @param[in] value    amount.
   */
  virtual void SetValue(const Amount& value);

 protected:
  Amount value_;           ///< amount
  Script locking_script_;  ///< locking script
}